

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XercesXPath::checkForSelectedAttributes(XercesXPath *this)

{
  unsigned_short uVar1;
  XercesLocationPath *this_00;
  XMLSize_t XVar2;
  XercesStep *this_01;
  XPathException *this_02;
  XercesLocationPath *local_50;
  XMLSize_t stepSize;
  XercesLocationPath *locPath;
  XMLSize_t i;
  XMLSize_t locSize;
  XercesXPath *this_local;
  
  if (this->fLocationPaths == (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) {
    local_50 = (XercesLocationPath *)0x0;
  }
  else {
    local_50 = (XercesLocationPath *)
               BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::size
                         (&this->fLocationPaths->
                           super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>);
  }
  locPath = (XercesLocationPath *)0x0;
  do {
    if (local_50 <= locPath) {
      return;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                        (&this->fLocationPaths->
                          super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,(XMLSize_t)locPath)
    ;
    XVar2 = XercesLocationPath::getStepSize(this_00);
    if (XVar2 != 0) {
      this_01 = XercesLocationPath::getStep(this_00,XVar2 - 1);
      uVar1 = XercesStep::getAxisType(this_01);
      if (uVar1 == 2) {
        this_02 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (this_02,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x178,XPath_NoAttrSelector,this->fMemoryManager);
        __cxa_throw(this_02,&XPathException::typeinfo,XPathException::~XPathException);
      }
    }
    locPath = (XercesLocationPath *)((long)&(locPath->super_XSerializable)._vptr_XSerializable + 1);
  } while( true );
}

Assistant:

void XercesXPath::checkForSelectedAttributes() {

    // verify that an attribute is not selected
    XMLSize_t locSize = (fLocationPaths) ? fLocationPaths->size() : 0;

    for (XMLSize_t i = 0; i < locSize; i++) {

        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        if (stepSize) {
            if (locPath->getStep(stepSize - 1)->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoAttrSelector, fMemoryManager);
            }
		}
    }
}